

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

void __thiscall icu_63::RBBITableBuilder::calcNullable(RBBITableBuilder *this,RBBINode *n)

{
  bool local_22;
  bool local_21;
  RBBINode *n_local;
  RBBITableBuilder *this_local;
  
  if (n != (RBBINode *)0x0) {
    if ((n->fType == setRef) || (n->fType == endMark)) {
      n->fNullable = '\0';
    }
    else if ((n->fType == lookAhead) || (n->fType == tag)) {
      n->fNullable = '\x01';
    }
    else {
      calcNullable(this,n->fLeftChild);
      calcNullable(this,n->fRightChild);
      if (n->fType == opOr) {
        local_21 = true;
        if (n->fLeftChild->fNullable == '\0') {
          local_21 = n->fRightChild->fNullable != '\0';
        }
        n->fNullable = local_21;
      }
      else if (n->fType == opCat) {
        local_22 = false;
        if (n->fLeftChild->fNullable != '\0') {
          local_22 = n->fRightChild->fNullable != '\0';
        }
        n->fNullable = local_22;
      }
      else if ((n->fType == opStar) || (n->fType == opQuestion)) {
        n->fNullable = '\x01';
      }
      else {
        n->fNullable = '\0';
      }
    }
  }
  return;
}

Assistant:

void RBBITableBuilder::calcNullable(RBBINode *n) {
    if (n == NULL) {
        return;
    }
    if (n->fType == RBBINode::setRef ||
        n->fType == RBBINode::endMark ) {
        // These are non-empty leaf node types.
        n->fNullable = FALSE;
        return;
    }

    if (n->fType == RBBINode::lookAhead || n->fType == RBBINode::tag) {
        // Lookahead marker node.  It's a leaf, so no recursion on children.
        // It's nullable because it does not match any literal text from the input stream.
        n->fNullable = TRUE;
        return;
    }


    // The node is not a leaf.
    //  Calculate nullable on its children.
    calcNullable(n->fLeftChild);
    calcNullable(n->fRightChild);

    // Apply functions from table 3.40 in Aho
    if (n->fType == RBBINode::opOr) {
        n->fNullable = n->fLeftChild->fNullable || n->fRightChild->fNullable;
    }
    else if (n->fType == RBBINode::opCat) {
        n->fNullable = n->fLeftChild->fNullable && n->fRightChild->fNullable;
    }
    else if (n->fType == RBBINode::opStar || n->fType == RBBINode::opQuestion) {
        n->fNullable = TRUE;
    }
    else {
        n->fNullable = FALSE;
    }
}